

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_event_push(ui_event *ke)

{
  ui_event *puVar1;
  term *ptVar2;
  ushort uVar3;
  
  ptVar2 = Term;
  if (ke != (ui_event *)0x0) {
    if (Term->key_tail == 0) {
      Term->key_tail = Term->key_size;
    }
    puVar1 = ptVar2->key_queue;
    uVar3 = ptVar2->key_tail - 1;
    ptVar2->key_tail = uVar3;
    *(undefined4 *)((long)puVar1 + (ulong)uVar3 * 0xc + 8) = *(undefined4 *)&(ke->key).mods;
    puVar1[uVar3].mouse = ke->mouse;
    return (errr)(ptVar2->key_head == ptVar2->key_tail);
  }
  return -1;
}

Assistant:

errr Term_event_push(const ui_event *ke)
{
	/* Hack -- Refuse to enqueue non-keys */
	if (!ke) return (-1);

	/* Hack -- Overflow may induce circular queue */
	if (Term->key_tail == 0) Term->key_tail = Term->key_size;

	/* Back up, Store the char */
	/* Store the char, advance the queue */
	Term->key_queue[--Term->key_tail] = *ke;

	/* Success (unless overflow) */
	if (Term->key_head != Term->key_tail) return (0);

	/* Problem */
	return (1);
}